

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot.c
# Opt level: O0

void spot_moveCards(Spot *fromSpot,uchar fromCardsIndex,uchar cardsToMoveCount,Spot *toSpot,
                   uchar toCardsIndex,_Bool reverseCards)

{
  code *pcVar1;
  byte bVar2;
  void *pvVar3;
  long in_RCX;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  uchar displacedCardsCount;
  
  if ((*(char *)(in_RCX + 2) == '\0') || (*(byte *)(in_RCX + 2) <= in_R8B)) {
    bVar2 = 0;
  }
  else {
    bVar2 = *(char *)(in_RCX + 2) - in_R8B;
  }
  pvVar3 = realloc(*(void **)(in_RCX + 8),
                   (long)(int)((uint)in_DL + (uint)*(byte *)(in_RCX + 2)) << 3);
  *(void **)(in_RCX + 8) = pvVar3;
  if (bVar2 != 0) {
    printf("TODO!! INSERTING cards, so displacing %d cards in destination\n",(ulong)bVar2);
    exit(1);
  }
  memcpy((void *)(*(long *)(in_RCX + 8) + (ulong)in_R8B * 8),
         (void *)(*(long *)(in_RDI + 8) + (ulong)in_SIL * 8),(ulong)in_DL << 3);
  if ((in_R9B & 1) != 0) {
    cards_reverse((Card **)(*(long *)(in_RCX + 8) + (ulong)in_R8B * 8),in_DL);
  }
  if (SCARRY4((uint)*(byte *)(in_RCX + 2),(uint)in_DL)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *(byte *)(in_RCX + 2) = *(byte *)(in_RCX + 2) + in_DL;
  if (SBORROW4((uint)*(byte *)(in_RDI + 2),(uint)in_DL)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *(byte *)(in_RDI + 2) = *(byte *)(in_RDI + 2) - in_DL;
  pvVar3 = realloc(*(void **)(in_RDI + 8),(ulong)*(byte *)(in_RDI + 2) << 3);
  *(void **)(in_RDI + 8) = pvVar3;
  return;
}

Assistant:

void spot_moveCards(Spot * fromSpot, unsigned char fromCardsIndex, unsigned char cardsToMoveCount, Spot * toSpot, unsigned char toCardsIndex, bool reverseCards)
{
	unsigned char displacedCardsCount = toSpot->cardsCount>0 && toCardsIndex<toSpot->cardsCount ? toSpot->cardsCount-toCardsIndex : 0;
	//printf("%d from %s%d %d to %s%d %d\n", cardsToMoveCount, fromSpot->name, fromSpot->index, fromCardsIndex, toSpot->name, toSpot->index, toCardsIndex);

	toSpot->cards = (Card **)realloc(toSpot->cards, sizeof(Card *)*(cardsToMoveCount+toSpot->cardsCount));
	if(displacedCardsCount>0)
	{
		printf("TODO!! INSERTING cards, so displacing %d cards in destination\n", displacedCardsCount);
		exit(EXIT_FAILURE);
		//memcpy(toSpot->cards+(sizeof(Card *)*((toSpot->cardsCount-toCardsIndex)+cardsToMoveCount)), toSpot->cards+(sizeof(Card *)*(toSpot->cardsCount-toCardsIndex)));
	}

	memcpy(&toSpot->cards[toCardsIndex], &fromSpot->cards[fromCardsIndex], sizeof(Card *)*cardsToMoveCount);
	if(reverseCards)
		cards_reverse(&toSpot->cards[toCardsIndex], cardsToMoveCount);
	toSpot->cardsCount+=cardsToMoveCount;

	fromSpot->cardsCount-=cardsToMoveCount;
	fromSpot->cards = (Card **)realloc(fromSpot->cards, sizeof(Card *)*fromSpot->cardsCount);
}